

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::compareGenMipmapBilinear
              (ConstPixelBufferAccess *dst,ConstPixelBufferAccess *src,PixelBufferAccess *errorMask,
              GenMipmapPrecision *precision)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int z;
  Vec4 result;
  RGBA local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  RGBA *local_e0;
  ConstPixelBufferAccess *local_d8;
  PixelBufferAccess *local_d0;
  LookupPrecision local_c8;
  Vec4 local_98;
  Sampler local_88;
  
  local_e0 = &local_f8;
  iVar3 = (dst->m_size).m_data[0];
  local_e8 = (float)(src->m_size).m_data[0];
  iVar5 = (dst->m_size).m_data[1];
  local_f0 = (float)(src->m_size).m_data[1];
  local_88.wrapS = CLAMP_TO_EDGE;
  local_88.wrapT = CLAMP_TO_EDGE;
  local_88.wrapR = CLAMP_TO_EDGE;
  local_88.minFilter = LINEAR;
  local_88.magFilter = LINEAR;
  local_88.lodThreshold = 0.0;
  local_88.normalizedCoords = false;
  local_88.depthStencilMode = MODE_DEPTH;
  local_88.compare = COMPAREMODE_NONE;
  local_88.compareChannel = 0;
  local_88.borderColor.v.uData[0]._0_1_ = 0;
  local_88.borderColor.v._1_7_ = 0;
  local_88.borderColor.v.uData[2]._0_1_ = 0;
  local_88._45_8_ = 0;
  local_c8.colorThreshold.m_data._0_8_ = *(undefined8 *)(precision->colorThreshold).m_data;
  local_c8.colorThreshold.m_data._8_8_ = *(undefined8 *)((precision->colorThreshold).m_data + 2);
  local_c8.colorMask.m_data = *&(precision->colorMask).m_data;
  local_c8.coordBits.m_data[0] = 0x16;
  local_c8.coordBits.m_data[1] = 0x16;
  local_c8.coordBits.m_data[2] = 0x16;
  local_c8.uvwBits.m_data[2] = (precision->filterBits).m_data[2];
  uVar1 = *(undefined8 *)(precision->filterBits).m_data;
  local_c8.uvwBits.m_data[0] = (int)uVar1;
  local_c8.uvwBits.m_data[1] = (int)((ulong)uVar1 >> 0x20);
  if (iVar5 < 1) {
    iVar4 = 0;
  }
  else {
    local_ec = (float)iVar3;
    local_f4 = (float)iVar5;
    iVar4 = 0;
    z = 0;
    local_d8 = src;
    local_d0 = errorMask;
    do {
      if (0 < iVar3) {
        local_e4 = (((float)z + 0.5) / local_f4) * local_f0;
        iVar5 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)dst,iVar5,z);
          local_98.m_data[0] = (((float)iVar5 + 0.5) / local_ec) * local_e8;
          local_98.m_data[1] = local_e4;
          bVar2 = tcu::isLinearSampleResultValid
                            (local_d8,&local_88,&local_c8,(Vec2 *)&local_98,0,
                             (Vec4 *)&stack0xffffffffffffffc0);
          if (bVar2) {
            local_f8.m_value = 0xff00ff00;
          }
          else {
            local_f8.m_value = 0xff0000ff;
          }
          tcu::RGBA::toVec(local_e0);
          tcu::PixelBufferAccess::setPixel(local_d0,&local_98,iVar5,z,0);
          iVar4 = iVar4 + (uint)!bVar2;
          iVar5 = iVar5 + 1;
          iVar3 = (dst->m_size).m_data[0];
        } while (iVar5 < iVar3);
        iVar5 = (dst->m_size).m_data[1];
      }
      z = z + 1;
    } while (z < iVar5);
  }
  return iVar4;
}

Assistant:

static int compareGenMipmapBilinear (const tcu::ConstPixelBufferAccess& dst, const tcu::ConstPixelBufferAccess& src, const tcu::PixelBufferAccess& errorMask, const GenMipmapPrecision& precision)
{
	DE_ASSERT(dst.getDepth() == 1 && src.getDepth() == 1); // \todo [2013-10-29 pyry] 3D textures.

	const float		dstW		= float(dst.getWidth());
	const float		dstH		= float(dst.getHeight());
	const float		srcW		= float(src.getWidth());
	const float		srcH		= float(src.getHeight());
	int				numFailed	= 0;

	// Translation to lookup verification parameters.
	const tcu::Sampler		sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
										 tcu::Sampler::LINEAR, tcu::Sampler::LINEAR, 0.0f, false /* non-normalized coords */);
	tcu::LookupPrecision	lookupPrec;

	lookupPrec.colorThreshold	= precision.colorThreshold;
	lookupPrec.colorMask		= precision.colorMask;
	lookupPrec.coordBits		= tcu::IVec3(22);
	lookupPrec.uvwBits			= precision.filterBits;

	for (int y = 0; y < dst.getHeight(); y++)
	for (int x = 0; x < dst.getWidth(); x++)
	{
		const tcu::Vec4	result	= dst.getPixel(x, y);
		const float		cx		= (float(x)+0.5f) / dstW * srcW;
		const float		cy		= (float(y)+0.5f) / dstH * srcH;
		const bool		isOk	= tcu::isLinearSampleResultValid(src, sampler, lookupPrec, tcu::Vec2(cx, cy), 0, result);

		errorMask.setPixel(isOk ? tcu::RGBA::green().toVec() : tcu::RGBA::red().toVec(), x, y);
		if (!isOk)
			numFailed += 1;
	}

	return numFailed;
}